

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginChildEx(char *name,ImGuiID id,ImVec2 *size_arg,bool border,ImGuiWindowFlags flags)

{
  float fVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *window_00;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  int iVar7;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 IVar8;
  float fVar9;
  float fVar10;
  char title [256];
  char local_138 [264];
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  IVar8 = (pIVar3->ContentRegionRect).Max;
  if ((pIVar3->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    IVar8.x = (pIVar3->WorkRect).Max.x;
  }
  fVar1 = size_arg->y;
  iVar7 = (int)size_arg->x;
  uVar2 = pIVar3->Flags;
  fVar9 = (float)(int)size_arg->x;
  fVar10 = (float)(int)fVar1;
  if ((iVar7 < 1) && (fVar9 = (IVar8.x - (pIVar3->DC).CursorPos.x) + fVar9, fVar9 <= 4.0)) {
    fVar9 = 4.0;
  }
  if ((fVar10 <= 0.0) && (fVar10 = fVar10 + (IVar8.y - (pIVar3->DC).CursorPos.y), fVar10 <= 4.0)) {
    fVar10 = 4.0;
  }
  *(byte *)&(GImGui->NextWindowData).Flags = (byte)(GImGui->NextWindowData).Flags | 2;
  IVar4.y = fVar10;
  IVar4.x = fVar9;
  (pIVar5->NextWindowData).SizeVal = IVar4;
  (pIVar5->NextWindowData).SizeCond = 1;
  if (name == (char *)0x0) {
    ImFormatString(local_138,0x100,"%s/%08X",pIVar3->Name,id);
  }
  else {
    ImFormatString(local_138,0x100,"%s/%s_%08X",pIVar3->Name,name,id);
  }
  fVar9 = (pIVar5->Style).ChildBorderSize;
  if (!border) {
    (pIVar5->Style).ChildBorderSize = 0.0;
  }
  bVar6 = Begin(local_138,(bool *)0x0,uVar2 & 4 | flags | 0x1000103);
  (pIVar5->Style).ChildBorderSize = fVar9;
  window_00 = pIVar5->CurrentWindow;
  window_00->ChildId = id;
  window_00->AutoFitChildAxises = ((int)fVar1 == 0) * '\x02' | iVar7 == 0;
  if (window_00->BeginCount == 1) {
    (pIVar3->DC).CursorPos = window_00->Pos;
  }
  if (((((uint)flags >> 0x17 & 1) == 0) && (pIVar5->NavActivateId == id)) &&
     (((window_00->DC).NavLayerActiveMask != 0 || ((window_00->DC).NavHasScroll == true)))) {
    FocusWindow(window_00);
    NavInitWindow(window_00,false);
    SetActiveID(id + 1,window_00);
    pIVar5->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return bVar6;
}

Assistant:

bool ImGui::BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;

    flags |= ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_ChildWindow;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    // Size
    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    SetNextWindowSize(size);

    // Build up name. If you need to append to a same child from multiple location in the ID stack, use BeginChild(ImGuiID id) with a stable value.
    char title[256];
    if (name)
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%s_%08X", parent_window->Name, name, id);
    else
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%08X", parent_window->Name, id);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    bool ret = Begin(title, NULL, flags);
    g.Style.ChildBorderSize = backup_border_size;

    ImGuiWindow* child_window = g.CurrentWindow;
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = (ImS8)auto_fit_axises;

    // Set the cursor to handle case where the user called SetNextWindowPos()+BeginChild() manually.
    // While this is not really documented/defined, it seems that the expected thing to do.
    if (child_window->BeginCount == 1)
        parent_window->DC.CursorPos = child_window->Pos;

    // Process navigation-in immediately so NavInit can run on first frame
    if (g.NavActivateId == id && !(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayerActiveMask != 0 || child_window->DC.NavHasScroll))
    {
        FocusWindow(child_window);
        NavInitWindow(child_window, false);
        SetActiveID(id+1, child_window); // Steal ActiveId with a dummy id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }
    return ret;
}